

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O2

int64_t parse_assignment(void)

{
  size_t sVar1;
  undefined1 *puVar2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  ulong unaff_RBX;
  char *pcVar6;
  long lVar7;
  size_t old_size;
  size_t sVar8;
  int32_t local_2c;
  
  local_2c = next_char();
  if (local_2c == 0x23) {
LAB_0011386a:
    prev_char(local_2c);
    return -1;
  }
  if (local_2c == 0x2e) {
    do {
      uVar4 = next_char();
    } while (uVar4 == 0x20);
    unaff_RBX = (ulong)uVar4;
    if (uVar4 == 10) {
      msg(4,"read terminating \'.\'");
      found_end_of_witness = 1;
      return -1;
    }
    if (uVar4 != 0xffffffff) {
      iVar5 = isprint(uVar4);
      if (iVar5 != 0) goto LAB_00113b36;
      pcVar6 = "unexpected character code 0x%02x after \'.\'";
      goto LAB_00113b3d;
    }
    pcVar6 = "end-of-file after \'.\' instead of new-line";
    goto LAB_00113b2f;
  }
  if (local_2c == 0x40) goto LAB_0011386a;
  if (local_2c == -1) goto LAB_00113b46;
  prev_char(local_2c);
  unaff_RBX = parse_unsigned_number(&local_2c);
  if (local_2c == 0x20) {
    iVar3 = next_char();
    _ZL11array_index_1 = _ZL11array_index_0;
    sVar1 = 1;
    if (iVar3 == 0x5b) {
      index_columno = columno + 1;
      while (uVar4 = next_char(), (uVar4 & 0xfffffffe) == 0x30) {
        if (_ZL11array_index_1 == _ZL11array_index_2) {
          lVar7 = (long)_ZL11array_index_1 - (long)_ZL11array_index_0;
          sVar8 = ((long)_ZL11array_index_1 - (long)_ZL11array_index_0) * 2;
          if (lVar7 == 0) {
            sVar8 = sVar1;
          }
          _ZL11array_index_0 = (undefined1 *)btorsim_realloc(_ZL11array_index_0,sVar8);
          _ZL11array_index_1 = _ZL11array_index_0 + lVar7;
          _ZL11array_index_2 = _ZL11array_index_0 + sVar8;
        }
        puVar2 = _ZL11array_index_1 + 1;
        *_ZL11array_index_1 = (char)uVar4;
        _ZL11array_index_1 = puVar2;
      }
      if (uVar4 == 0x2a) {
        if (_ZL11array_index_1 == _ZL11array_index_2) {
          lVar7 = (long)_ZL11array_index_1 - (long)_ZL11array_index_0;
          sVar8 = ((long)_ZL11array_index_1 - (long)_ZL11array_index_0) * 2;
          if (lVar7 == 0) {
            sVar8 = sVar1;
          }
          _ZL11array_index_0 = (undefined1 *)btorsim_realloc(_ZL11array_index_0,sVar8);
          _ZL11array_index_1 = _ZL11array_index_0 + lVar7;
          _ZL11array_index_2 = _ZL11array_index_0 + sVar8;
        }
        puVar2 = _ZL11array_index_1 + 1;
        *_ZL11array_index_1 = 0x2a;
        _ZL11array_index_1 = puVar2;
        uVar4 = next_char();
      }
      if (uVar4 != 0x5d) {
        pcVar6 = "expected ] after index";
        goto LAB_00113b2f;
      }
      lVar7 = (long)_ZL11array_index_1 - (long)_ZL11array_index_0;
      if (lVar7 == 0) {
        pcVar6 = "empty index";
        goto LAB_00113b2f;
      }
      if (_ZL11array_index_1 == _ZL11array_index_2) {
        _ZL11array_index_0 = (undefined1 *)btorsim_realloc(_ZL11array_index_0,lVar7 * 2);
        _ZL11array_index_1 = _ZL11array_index_0 + lVar7;
        _ZL11array_index_2 = _ZL11array_index_0 + lVar7 * 2;
      }
      puVar2 = _ZL11array_index_1 + 1;
      *_ZL11array_index_1 = 0;
      _ZL11array_index_1 = puVar2;
      iVar3 = next_char();
      if (iVar3 != 0x20) {
        pcVar6 = "space missing after index";
        goto LAB_00113b2f;
      }
    }
    else {
      prev_char(iVar3);
    }
    _ZL8constant_1 = _ZL8constant_0;
    constant_columno = columno + 1;
    while (uVar4 = next_char(), (uVar4 & 0xfffffffe) == 0x30) {
      if (_ZL8constant_1 == _ZL8constant_2) {
        lVar7 = (long)_ZL8constant_1 - (long)_ZL8constant_0;
        sVar8 = ((long)_ZL8constant_1 - (long)_ZL8constant_0) * 2;
        if (lVar7 == 0) {
          sVar8 = sVar1;
        }
        _ZL8constant_0 = (undefined1 *)btorsim_realloc(_ZL8constant_0,sVar8);
        _ZL8constant_1 = _ZL8constant_0 + lVar7;
        _ZL8constant_2 = _ZL8constant_0 + sVar8;
      }
      puVar2 = _ZL8constant_1 + 1;
      *_ZL8constant_1 = (char)uVar4;
      _ZL8constant_1 = puVar2;
    }
    lVar7 = (long)_ZL8constant_1 - (long)_ZL8constant_0;
    if (lVar7 != 0) {
      if ((uVar4 == 10) || (uVar4 == 0x20)) {
        if (_ZL8constant_1 == _ZL8constant_2) {
          _ZL8constant_0 = (undefined1 *)btorsim_realloc(_ZL8constant_0,lVar7 * 2);
          _ZL8constant_1 = _ZL8constant_0 + lVar7;
          _ZL8constant_2 = _ZL8constant_0 + lVar7 * 2;
        }
        puVar2 = _ZL8constant_1 + 1;
        *_ZL8constant_1 = 0;
        _ZL8constant_1 = puVar2;
        _ZL6symbol_1 = _ZL6symbol_0;
        while( true ) {
          do {
            if (uVar4 == 10) {
              lVar7 = (long)_ZL6symbol_1 - (long)_ZL6symbol_0;
              if (lVar7 != 0) {
                if (_ZL6symbol_1 == _ZL6symbol_2) {
                  _ZL6symbol_0 = (undefined1 *)btorsim_realloc(_ZL6symbol_0,lVar7 * 2);
                  _ZL6symbol_1 = _ZL6symbol_0 + lVar7;
                  _ZL6symbol_2 = _ZL6symbol_0 + lVar7 * 2;
                }
                puVar2 = _ZL6symbol_1 + 1;
                *_ZL6symbol_1 = 0;
                _ZL6symbol_1 = puVar2;
                return unaff_RBX;
              }
              return unaff_RBX;
            }
            uVar4 = next_char();
          } while (uVar4 == 10);
          if (uVar4 == 0xffffffff) break;
          if (_ZL6symbol_1 == _ZL6symbol_2) {
            lVar7 = (long)_ZL6symbol_1 - (long)_ZL6symbol_0;
            sVar8 = ((long)_ZL6symbol_1 - (long)_ZL6symbol_0) * 2;
            if (lVar7 == 0) {
              sVar8 = sVar1;
            }
            _ZL6symbol_0 = (undefined1 *)btorsim_realloc(_ZL6symbol_0,sVar8);
            _ZL6symbol_1 = _ZL6symbol_0 + lVar7;
            _ZL6symbol_2 = _ZL6symbol_0 + sVar8;
          }
          puVar2 = _ZL6symbol_1 + 1;
          *_ZL6symbol_1 = (char)uVar4;
          _ZL6symbol_1 = puVar2;
        }
        pcVar6 = "unexpected end-of-file in assignment";
      }
      else {
        pcVar6 = "expected space or new-line after assignment";
      }
      goto LAB_00113b2f;
    }
  }
  else {
    parse_error("space missing after \'%ld\'",unaff_RBX);
  }
  pcVar6 = "empty constant";
LAB_00113b2f:
  do {
    parse_error(pcVar6);
LAB_00113b36:
    pcVar6 = "unexpected character \'%c\' after \'.\'";
LAB_00113b3d:
    parse_error(pcVar6,unaff_RBX & 0xffffffff);
LAB_00113b46:
    pcVar6 = "unexpected end-of-file (without \'.\')";
  } while( true );
}

Assistant:

static int64_t
parse_assignment ()
{
  int32_t ch = next_char ();
  if (ch == EOF) parse_error ("unexpected end-of-file (without '.')");
  if (ch == '.')
  {
    while ((ch = next_char ()) == ' ')
      ;
    if (ch == EOF) parse_error ("end-of-file after '.' instead of new-line");
    if (ch != '\n')
    {
      if (isprint (ch))
        parse_error ("unexpected character '%c' after '.'", ch);
      else
        parse_error ("unexpected character code 0x%02x after '.'", ch);
    }
    msg (4, "read terminating '.'");
    found_end_of_witness = 1;
    return -1;
  }
  if (ch == '@' || ch == '#')
  {
    prev_char (ch);
    return -1;
  }
  prev_char (ch);
  int64_t res = parse_unsigned_number (&ch);
  if (ch != ' ') parse_error ("space missing after '%" PRId64 "'", res);
  ch = next_char ();
  BTOR2_RESET_STACK (array_index);
  if (ch == '[')
  {
    index_columno = columno + 1;
    while ((ch = next_char ()) == '0' || ch == '1')
      BTOR2_PUSH_STACK (array_index, ch);
    /* btormc trace compatibility: btormc --trace-gen-full represents
     * 'initialize all array elements' as <id> [*] <value> */
    if (ch == '*')
    {
      BTOR2_PUSH_STACK (array_index, ch);
      ch = next_char ();
    }
    if (ch != ']') parse_error ("expected ] after index");
    if (BTOR2_EMPTY_STACK (array_index)) parse_error ("empty index");
    BTOR2_PUSH_STACK (array_index, 0);
    ch = next_char ();
    if (ch != ' ') parse_error ("space missing after index");
  }
  else
  {
    prev_char (ch);
  }
  BTOR2_RESET_STACK (constant);
  constant_columno = columno + 1;
  while ((ch = next_char ()) == '0' || ch == '1')
    BTOR2_PUSH_STACK (constant, ch);
  if (BTOR2_EMPTY_STACK (constant))
    parse_error ("empty constant");
  else if (ch != ' ' && ch != '\n')
    parse_error ("expected space or new-line after assignment");
  BTOR2_PUSH_STACK (constant, 0);
  BTOR2_RESET_STACK (symbol);
  while (ch != '\n')
    if ((ch = next_char ()) == EOF)
      parse_error ("unexpected end-of-file in assignment");
    else if (ch != '\n')
      BTOR2_PUSH_STACK (symbol, ch);
  if (!BTOR2_EMPTY_STACK (symbol)) BTOR2_PUSH_STACK (symbol, 0);
  return res;
}